

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O1

b_str<char32_t> *
detail::operator|(b_str<char32_t> *__return_storage_ptr__,b_str<char32_t> *str,
                 split_helper_subroutine<detail::split_at_first_back,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_char32_t>
                 *info)

{
  size_type sVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar5;
  size_type *psVar6;
  size_type __n;
  size_type sVar7;
  
  uVar4 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
          find_first_of(str,&info->delim,0);
  if (uVar4 == 0xffffffffffffffff) {
    paVar5 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar5;
    psVar6 = &__return_storage_ptr__->_M_string_length;
  }
  else {
    __n = 0xffffffffffffffff;
    if ((uVar4 < str->_M_string_length) &&
       (sVar1 = (info->delim)._M_string_length, __n = uVar4, sVar1 != 0)) {
      do {
        sVar7 = 0;
        while ((info->delim)._M_dataplus._M_p[sVar7] != (str->_M_dataplus)._M_p[uVar4]) {
          sVar7 = sVar7 + 1;
          __n = uVar4;
          if (sVar1 == sVar7) goto LAB_001b30bb;
        }
        uVar4 = uVar4 + 1;
        __n = 0xffffffffffffffff;
      } while (uVar4 != str->_M_string_length);
    }
LAB_001b30bb:
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    erase(str,0,__n);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (str->_M_dataplus)._M_p;
    paVar5 = &str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)pcVar2 == paVar5) {
      uVar3 = *(undefined8 *)((long)&str->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    psVar6 = &str->_M_string_length;
    __return_storage_ptr__->_M_string_length = str->_M_string_length;
    (str->_M_dataplus)._M_p = (pointer)paVar5;
  }
  *psVar6 = 0;
  paVar5->_M_local_buf[0] = L'\0';
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first_back, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return {};
		str.erase(0, str.find_first_not_of(info.delim, pos));
		return std::move(str);
	}